

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cFramebufferNoAttachmentsTests.cpp
# Opt level: O3

void glcts::checkErrorEqualsExpected(GLenum err,GLenum expected,char *msg,char *file,int line)

{
  ostream *stream;
  OutOfMemoryError *this;
  size_t sVar1;
  ostringstream msgStr;
  Enum<int,_2UL> local_1d8 [2];
  Enum<int,_2UL> local_1b8;
  ostream local_1a8;
  
  if (err == expected) {
    return;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>(&local_1a8,"glGetError() returned ",0x16);
  local_1d8[0].m_getName = glu::getErrorName;
  local_1d8[0].m_value = err;
  stream = tcu::Format::Enum<int,_2UL>::toStream(local_1d8,&local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>(stream,", expected ",0xb);
  local_1b8.m_getName = glu::getErrorName;
  local_1b8.m_value = expected;
  tcu::Format::Enum<int,_2UL>::toStream(&local_1b8,stream);
  if (msg != (char *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>(&local_1a8," in \'",5);
    sVar1 = strlen(msg);
    std::__ostream_insert<char,std::char_traits<char>>(&local_1a8,msg,sVar1);
    std::__ostream_insert<char,std::char_traits<char>>(&local_1a8,"\'",1);
  }
  this = (OutOfMemoryError *)__cxa_allocate_exception(0x38);
  if (err == 0x505) {
    std::__cxx11::stringbuf::str();
    glu::OutOfMemoryError::OutOfMemoryError
              (this,(char *)local_1d8[0].m_getName,fixed_sample_locations_values + 1,file,line);
    __cxa_throw(this,&glu::OutOfMemoryError::typeinfo,glu::OutOfMemoryError::~OutOfMemoryError);
  }
  std::__cxx11::stringbuf::str();
  glu::Error::Error((Error *)this,err,(char *)local_1d8[0].m_getName,
                    fixed_sample_locations_values + 1,file,line);
  __cxa_throw(this,&glu::Error::typeinfo,glu::Error::~Error);
}

Assistant:

void checkErrorEqualsExpected(GLenum err, GLenum expected, const char* msg, const char* file, int line)
{
	if (err != expected)
	{
		std::ostringstream msgStr;
		msgStr << "glGetError() returned " << glu::getErrorStr(err) << ", expected " << glu::getErrorStr(expected);

		if (msg)
			msgStr << " in '" << msg << "'";

		if (err == GL_OUT_OF_MEMORY)
			throw glu::OutOfMemoryError(msgStr.str().c_str(), "", file, line);
		else
			throw glu::Error(err, msgStr.str().c_str(), "", file, line);
	}
}